

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O0

bool testing::internal::Base64Unescape(string *encoded,string *decoded)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pcVar4;
  const_reference pvVar5;
  char src_bin;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  int src;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  char dst;
  int bit_pos;
  size_t encoded_len;
  string *decoded_local;
  string *encoded_local;
  
  std::__cxx11::string::clear();
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)decoded);
  __range2._4_4_ = 0;
  __end2._M_current = (char *)std::__cxx11::string::begin();
  _Stack_48._M_current = (char *)std::__cxx11::string::end();
  do {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb8);
    if (!bVar1) {
      return true;
    }
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    iVar2 = (int)*pcVar4;
    iVar3 = isspace(iVar2);
    if ((iVar3 == 0) && (iVar2 != 0x3d)) {
      pvVar5 = std::array<char,_256UL>::operator[]
                         ((array<char,_256UL> *)
                          "AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAA>A>A?456789:;<=AAAAAAA",
                          (long)iVar2);
      if ('?' < *pvVar5) {
        std::__cxx11::string::clear();
        return false;
      }
      if (__range2._4_4_ == 0) {
        __range2._4_4_ = 6;
      }
      else {
        std::__cxx11::string::push_back((char)decoded);
        __range2._4_4_ = (__range2._4_4_ + 6) % 8;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool Base64Unescape(const std::string& encoded, std::string* decoded) {
  decoded->clear();
  size_t encoded_len = encoded.size();
  decoded->reserve(3 * (encoded_len / 4) + (encoded_len % 4));
  int bit_pos = 0;
  char dst = 0;
  for (int src : encoded) {
    if (std::isspace(src) || src == '=') {
      continue;
    }
    char src_bin = kUnBase64[static_cast<size_t>(src)];
    if (src_bin >= 64) {
      decoded->clear();
      return false;
    }
    if (bit_pos == 0) {
      dst |= static_cast<char>(src_bin << 2);
      bit_pos = 6;
    } else {
      dst |= static_cast<char>(src_bin >> (bit_pos - 2));
      decoded->push_back(dst);
      dst = static_cast<char>(src_bin << (10 - bit_pos));
      bit_pos = (bit_pos + 6) % 8;
    }
  }
  return true;
}